

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O1

void Saig_ManWindowCreatePis(Aig_Man_t *pNew,Aig_Man_t *p0,Aig_Man_t *p1,Vec_Ptr_t *vNodes0)

{
  int *piVar1;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  long lVar6;
  Aig_Obj_t *pAVar7;
  
  if (0 < vNodes0->nSize) {
    lVar6 = 0;
    do {
      piVar1 = (int *)vNodes0->pArray[lVar6];
      if ((((uint)*(undefined8 *)(piVar1 + 6) & 7) == 2) && (p0->nTruePis <= *piVar1)) {
        if (*piVar1 < p0->nTruePis) {
          __assert_fail("Saig_ObjIsLo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                        ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
        }
        uVar2 = (*piVar1 - p0->nTruePis) + p0->nTruePos;
        if (((int)uVar2 < 0) || (p0->vCos->nSize <= (int)uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar7 = (Aig_Obj_t *)(*(ulong *)((long)p0->vCos->pArray[uVar2] + 8) & 0xfffffffffffffffe);
        if ((pAVar7->TravId != p0->nTravIds) && ((pAVar7->field_5).pData == (void *)0x0)) {
          pAVar3 = Aig_ObjCreateCi(pNew);
          (pAVar7->field_5).pData = pAVar3;
          if (p0->pReprs == (Aig_Obj_t **)0x0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = p0->pReprs[pAVar7->Id];
          }
          if (p1->pReprs == (Aig_Obj_t **)0x0) {
            pAVar5 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar5 = p1->pReprs[pAVar4->Id];
          }
          if (pAVar5 != pAVar7) {
            __assert_fail("pFanin == Aig_ObjRepr( p1, pMatch )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                          ,0x25d,
                          "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                         );
          }
          if (pAVar4 == (Aig_Obj_t *)0x0) {
            __assert_fail("pMatch != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                          ,0x25e,
                          "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                         );
          }
LAB_006f3c4c:
          (pAVar4->field_5).pData = pAVar3;
        }
      }
      else {
        if (((uint)*(undefined8 *)(piVar1 + 6) & 7) - 7 < 0xfffffffe) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                        ,0x265,
                        "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
        pAVar7 = (Aig_Obj_t *)(*(ulong *)(piVar1 + 2) & 0xfffffffffffffffe);
        if ((pAVar7->TravId != p0->nTravIds) && ((pAVar7->field_5).pData == (void *)0x0)) {
          pAVar3 = Aig_ObjCreateCi(pNew);
          (pAVar7->field_5).pData = pAVar3;
          if (p0->pReprs == (Aig_Obj_t **)0x0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = p0->pReprs[pAVar7->Id];
          }
          if (p1->pReprs == (Aig_Obj_t **)0x0) {
            pAVar5 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar5 = p1->pReprs[pAVar4->Id];
          }
          if (pAVar5 != pAVar7) {
            __assert_fail("pFanin == Aig_ObjRepr( p1, pMatch )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                          ,0x26b,
                          "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                         );
          }
          if (pAVar4 == (Aig_Obj_t *)0x0) {
            __assert_fail("pMatch != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                          ,0x26c,
                          "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                         );
          }
          (pAVar4->field_5).pData = pAVar3;
        }
        pAVar7 = (Aig_Obj_t *)(*(ulong *)(piVar1 + 4) & 0xfffffffffffffffe);
        if ((pAVar7->TravId != p0->nTravIds) && ((pAVar7->field_5).pData == (void *)0x0)) {
          pAVar3 = Aig_ObjCreateCi(pNew);
          (pAVar7->field_5).pData = pAVar3;
          if (p0->pReprs == (Aig_Obj_t **)0x0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = p0->pReprs[pAVar7->Id];
          }
          if (p1->pReprs == (Aig_Obj_t **)0x0) {
            pAVar5 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar5 = p1->pReprs[pAVar4->Id];
          }
          if (pAVar5 != pAVar7) {
            __assert_fail("pFanin == Aig_ObjRepr( p1, pMatch )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                          ,0x275,
                          "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                         );
          }
          if (pAVar4 == (Aig_Obj_t *)0x0) {
            __assert_fail("pMatch != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                          ,0x276,
                          "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                         );
          }
          goto LAB_006f3c4c;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vNodes0->nSize);
  }
  return;
}

Assistant:

void Saig_ManWindowCreatePis( Aig_Man_t * pNew, Aig_Man_t * p0, Aig_Man_t * p1, Vec_Ptr_t * vNodes0 )
{
    Aig_Obj_t * pObj, * pMatch, * pFanin;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pObj, i )
    {
        if ( Saig_ObjIsLo(p0, pObj) )
        {
            pMatch = Saig_ObjLoToLi( p0, pObj );
            pFanin = Aig_ObjFanin0(pMatch);
            if ( !Aig_ObjIsTravIdCurrent(p0, pFanin) && pFanin->pData == NULL )
            {
                pFanin->pData = Aig_ObjCreateCi(pNew);
                pMatch = Aig_ObjRepr( p0, pFanin );
                assert( pFanin == Aig_ObjRepr( p1, pMatch ) );
                assert( pMatch != NULL );
                pMatch->pData = pFanin->pData;
                Counter++;
            }
        }
        else
        {
            assert( Aig_ObjIsNode(pObj) );
            pFanin = Aig_ObjFanin0(pObj);
            if ( !Aig_ObjIsTravIdCurrent(p0, pFanin) && pFanin->pData == NULL )
            {
                pFanin->pData = Aig_ObjCreateCi(pNew);
                pMatch = Aig_ObjRepr( p0, pFanin );
                assert( pFanin == Aig_ObjRepr( p1, pMatch ) );
                assert( pMatch != NULL );
                pMatch->pData = pFanin->pData;
                Counter++;
            }
            pFanin = Aig_ObjFanin1(pObj);
            if ( !Aig_ObjIsTravIdCurrent(p0, pFanin) && pFanin->pData == NULL )
            {
                pFanin->pData = Aig_ObjCreateCi(pNew);
                pMatch = Aig_ObjRepr( p0, pFanin );
                assert( pFanin == Aig_ObjRepr( p1, pMatch ) );
                assert( pMatch != NULL );
                pMatch->pData = pFanin->pData;
                Counter++;
            }
        }
    }
//    printf( "Added %d primary inputs.\n", Counter );
}